

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_avx2.c
# Opt level: O0

void aom_highbd_convolve_copy_avx2
               (uint16_t *src,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  __m256i s_3 [4];
  __m256i s_2 [2];
  __m128i s_1 [2];
  __m128i s [2];
  uint16_t *in_stack_fffffffffffffca8;
  uint16_t *in_stack_fffffffffffffcb0;
  uint16_t *in_stack_fffffffffffffd28;
  uint16_t *in_stack_fffffffffffffd30;
  int local_2c8;
  undefined8 *local_2b8;
  undefined8 *local_2a8;
  
  local_2c8 = in_R9D;
  local_2b8 = in_RDX;
  local_2a8 = in_RDI;
  if (in_R8D == 2) {
    do {
      *(undefined4 *)local_2b8 = *(undefined4 *)local_2a8;
      puVar17 = (undefined4 *)(in_RSI * 2 + (long)local_2a8);
      puVar18 = (undefined4 *)(in_RCX * 2 + (long)local_2b8);
      *puVar18 = *puVar17;
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)puVar17);
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)puVar18);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  else if (in_R8D == 4) {
    do {
      uVar1 = *local_2a8;
      local_2a8 = (undefined8 *)((long)local_2a8 + in_RSI * 2);
      uVar2 = *local_2a8;
      local_2a8 = (undefined8 *)((long)local_2a8 + in_RSI * 2);
      *local_2b8 = uVar1;
      local_2b8 = (undefined8 *)((long)local_2b8 + in_RCX * 2);
      *local_2b8 = uVar2;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  else if (in_R8D == 8) {
    do {
      uVar1 = *local_2a8;
      uVar2 = local_2a8[1];
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)local_2a8);
      uVar3 = *local_2a8;
      uVar4 = local_2a8[1];
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)local_2a8);
      *local_2b8 = uVar1;
      local_2b8[1] = uVar2;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      *local_2b8 = uVar3;
      local_2b8[1] = uVar4;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  else if (in_R8D == 0x10) {
    do {
      uVar1 = *local_2a8;
      uVar2 = local_2a8[1];
      uVar3 = local_2a8[2];
      uVar4 = local_2a8[3];
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)local_2a8);
      uVar5 = *local_2a8;
      uVar6 = local_2a8[1];
      uVar7 = local_2a8[2];
      uVar8 = local_2a8[3];
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)local_2a8);
      *local_2b8 = uVar1;
      local_2b8[1] = uVar2;
      local_2b8[2] = uVar3;
      local_2b8[3] = uVar4;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      *local_2b8 = uVar5;
      local_2b8[1] = uVar6;
      local_2b8[2] = uVar7;
      local_2b8[3] = uVar8;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  else if (in_R8D == 0x20) {
    do {
      uVar1 = *local_2a8;
      uVar2 = local_2a8[1];
      uVar3 = local_2a8[2];
      uVar4 = local_2a8[3];
      uVar5 = local_2a8[4];
      uVar6 = local_2a8[5];
      uVar7 = local_2a8[6];
      uVar8 = local_2a8[7];
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)local_2a8);
      uVar9 = *local_2a8;
      uVar10 = local_2a8[1];
      uVar11 = local_2a8[2];
      uVar12 = local_2a8[3];
      uVar13 = local_2a8[4];
      uVar14 = local_2a8[5];
      uVar15 = local_2a8[6];
      uVar16 = local_2a8[7];
      local_2a8 = (undefined8 *)(in_RSI * 2 + (long)local_2a8);
      *local_2b8 = uVar1;
      local_2b8[1] = uVar2;
      local_2b8[2] = uVar3;
      local_2b8[3] = uVar4;
      local_2b8[4] = uVar5;
      local_2b8[5] = uVar6;
      local_2b8[6] = uVar7;
      local_2b8[7] = uVar8;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      *local_2b8 = uVar9;
      local_2b8[1] = uVar10;
      local_2b8[2] = uVar11;
      local_2b8[3] = uVar12;
      local_2b8[4] = uVar13;
      local_2b8[5] = uVar14;
      local_2b8[6] = uVar15;
      local_2b8[7] = uVar16;
      local_2b8 = (undefined8 *)(in_RCX * 2 + (long)local_2b8);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  else if (in_R8D == 0x40) {
    do {
      highbd_copy_64(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      highbd_copy_64(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  else {
    do {
      highbd_copy_128(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      highbd_copy_128(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      local_2c8 = local_2c8 + -2;
    } while (local_2c8 != 0);
  }
  return;
}

Assistant:

void aom_highbd_convolve_copy_avx2(const uint16_t *src, ptrdiff_t src_stride,
                                   uint16_t *dst, ptrdiff_t dst_stride, int w,
                                   int h) {
  // The w == 8 case uses _mm_store_si128(), which requires its output address
  // be aligned on a 16-byte boundary.
  if (w == 8) {
    assert(!((intptr_t)dst % 16));
    assert(!(dst_stride % 8));
  }

  if (w == 2) {
    do {
      memmove(dst, src, 2 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      memmove(dst, src, 2 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 4) {
    do {
      __m128i s[2];
      s[0] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      _mm_storel_epi64((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_storel_epi64((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 8) {
    do {
      __m128i s[2];
      s[0] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      _mm_store_si128((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 16) {
    do {
      __m256i s[2];
      s[0] = _mm256_loadu_si256((__m256i *)src);
      src += src_stride;
      s[1] = _mm256_loadu_si256((__m256i *)src);
      src += src_stride;
      _mm256_storeu_si256((__m256i *)dst, s[0]);
      dst += dst_stride;
      _mm256_storeu_si256((__m256i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 32) {
    do {
      __m256i s[4];
      s[0] = _mm256_loadu_si256((__m256i *)(src + 0 * 16));
      s[1] = _mm256_loadu_si256((__m256i *)(src + 1 * 16));
      src += src_stride;
      s[2] = _mm256_loadu_si256((__m256i *)(src + 0 * 16));
      s[3] = _mm256_loadu_si256((__m256i *)(src + 1 * 16));
      src += src_stride;
      _mm256_storeu_si256((__m256i *)(dst + 0 * 16), s[0]);
      _mm256_storeu_si256((__m256i *)(dst + 1 * 16), s[1]);
      dst += dst_stride;
      _mm256_storeu_si256((__m256i *)(dst + 0 * 16), s[2]);
      _mm256_storeu_si256((__m256i *)(dst + 1 * 16), s[3]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 64) {
    do {
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else {
    assert(w == 128);
    do {
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  }
}